

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O3

void __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::reMax
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,int newSize,int newHashSize)

{
  undefined1 auVar1 [16];
  states *psVar2;
  pointer pEVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  pointer pEVar7;
  long lVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  save;
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  local_38;
  
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  ::Array(&local_38,&this->m_elem);
  if (newSize < this->m_used) {
    newSize = this->m_used;
  }
  std::
  vector<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
  ::resize((vector<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
            *)this,(long)newSize);
  auVar1 = _DAT_003561b0;
  pEVar7 = (this->m_elem).data.
           super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (int)((long)(this->m_elem).data.
                      super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar7 >> 3) * -0x55555555;
  if (0 < (int)uVar4) {
    uVar5 = (ulong)(uVar4 + 3 & 0xfffffffc);
    lVar6 = (ulong)(uVar4 & 0x7fffffff) - 1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    psVar2 = (states *)((long)(pEVar7 + 3) + 0x10);
    auVar9 = auVar9 ^ _DAT_003561b0;
    auVar11 = _DAT_00356190;
    auVar12 = _DAT_003561a0;
    do {
      auVar13 = auVar12 ^ auVar1;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar10 && auVar9._0_4_ < auVar13._0_4_ || iVar10 < auVar13._4_4_
                  ) & 1)) {
        psVar2[-0x12] = 0;
      }
      if ((auVar13._12_4_ != auVar9._12_4_ || auVar13._8_4_ <= auVar9._8_4_) &&
          auVar13._12_4_ <= auVar9._12_4_) {
        psVar2[-0xc] = 0;
      }
      auVar13 = auVar11 ^ auVar1;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar10 && (iVar14 != iVar10 || auVar13._0_4_ <= auVar9._0_4_)) {
        psVar2[-6] = 0;
        *psVar2 = FREE;
      }
      lVar6 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar6 + 4;
      lVar6 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar6 + 4;
      psVar2 = psVar2 + 0x18;
      uVar5 = uVar5 - 4;
    } while (uVar5 != 0);
  }
  this->m_used = 0;
  if (newHashSize < 1) {
    newHashSize = autoHashSize(this);
  }
  this->m_hashsize = newHashSize;
  pEVar7 = local_38.data.
           super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)local_38.data.
                              super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_38.data.
                             super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar6 = 8;
    lVar8 = 0;
    pEVar3 = local_38.data.
             super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (*(int *)((long)&(pEVar7->info).info + lVar6) == 2) {
        add(this,(Name *)((long)pEVar7 + lVar6 + -8),(DataKey *)((long)&(pEVar7->item).name + lVar6)
           );
        pEVar3 = local_38.data.
                 super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pEVar7 = local_38.data.
                 super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0x18;
    } while (lVar8 < (int)((ulong)((long)pEVar3 - (long)pEVar7) >> 3) * -0x55555555);
  }
  if (pEVar7 != (pointer)0x0) {
    operator_delete(pEVar7,(long)local_38.data.
                                 super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar7);
  }
  return;
}

Assistant:

void reMax(int newSize = -1, int newHashSize = 0)
   {
      Array< Elem > save(m_elem);

      m_elem.reSize(newSize < m_used ? m_used : newSize);

      clear();

      m_hashsize = (newHashSize < 1) ? autoHashSize() : newHashSize;

      for(int i = 0; i < save.size(); i++)
         if(save[i].stat == Elem::USED)
            add(save[i].item, save[i].info);
   }